

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall QScroller::scrollTo(QScroller *this,QPointF *pos,int scrollTime)

{
  undefined1 auVar1 [16];
  QScrollerPrivate *this_00;
  undefined1 auVar2 [12];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [12];
  QDebug this_01;
  bool bVar6;
  char cVar7;
  int iVar8;
  State newstate;
  long in_FS_OFFSET;
  qreal qVar9;
  qreal qVar10;
  qreal v;
  undefined1 auVar11 [16];
  QPointF QVar12;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  QPointF local_b8;
  undefined4 uStack_a8;
  undefined4 local_a4;
  char *local_a0;
  QDebug local_90;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d_ptr;
  if (1 < this_00->state - Pressed) {
    if (this_00->state == Inactive) {
      local_b8.xp._0_4_ = 0;
      local_b8._4_8_ = 0;
      local_b8.yp._4_4_ = 0;
      bVar6 = QScrollerPrivate::prepareScrolling(this_00,&local_b8);
      if (!bVar6) goto LAB_00662759;
    }
    auVar1._0_8_ = (this_00->contentPosRange).xp;
    auVar1._8_8_ = (this_00->contentPosRange).yp;
    auVar11._0_8_ = (this_00->contentPosRange).w + (double)auVar1._0_8_;
    auVar11._8_8_ = (this_00->contentPosRange).h + (double)auVar1._8_8_;
    auVar11 = minpd(auVar11,(undefined1  [16])*pos);
    QVar12 = (QPointF)maxpd(auVar11,auVar1);
    local_68 = QVar12;
    qVar9 = QScrollerPrivate::nextSnapPos(this_00,QVar12.xp,0,Horizontal);
    uStack_c4 = QVar12.xp._4_4_;
    uStack_c0 = QVar12.yp._0_4_;
    uStack_bc = QVar12.yp._4_4_;
    auVar5._4_8_ = extraout_XMM0_Qb;
    auVar5._0_4_ = uStack_c4;
    auVar13._0_8_ = auVar5._0_8_ << 0x20;
    auVar13._8_4_ = uStack_c0;
    auVar13._12_4_ = uStack_bc;
    qVar10 = QScrollerPrivate::nextSnapPos(this_00,auVar13._8_8_,0,Vertical);
    cVar7 = qIsNaN(qVar9);
    if (cVar7 == '\0') {
      local_68.xp = qVar9;
    }
    cVar7 = qIsNaN(qVar10);
    if (cVar7 == '\0') {
      local_68.yp = qVar10;
    }
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_b8.xp._0_4_ = 2;
      local_b8._4_8_ = 0;
      local_b8.yp._4_4_ = 0;
      uStack_a8 = 0;
      local_a4 = 0;
      local_a0 = lcScroller::category.name;
      QMessageLogger::debug();
      this_01.stream = local_90.stream;
      QVar14.m_data = (storage_type *)0x18;
      QVar14.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      local_88.xp = (qreal)local_90.stream;
      *(int *)(local_90.stream + 0x28) = *(int *)(local_90.stream + 0x28) + 1;
      ::operator<<((QDebug)&local_88.yp,&local_88);
      qVar9 = local_88.yp;
      QVar15.m_data = (storage_type *)0xe;
      QVar15.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)qVar9,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_88.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.yp,' ');
      }
      local_78.xp = local_88.yp;
      *(int *)((long)local_88.yp + 0x28) = *(int *)((long)local_88.yp + 0x28) + 1;
      ::operator<<((QDebug)&local_78.yp,&local_78);
      qVar9 = local_78.yp;
      QVar16.m_data = (storage_type *)0x2;
      QVar16.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<((QTextStream *)qVar9,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      QTextStream::operator<<((QTextStream *)local_78.yp,scrollTime);
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      qVar9 = local_78.yp;
      QVar17.m_data = (storage_type *)0x6;
      QVar17.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar17);
      QTextStream::operator<<((QTextStream *)qVar9,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      QDebug::~QDebug((QDebug *)&local_78.yp);
      QDebug::~QDebug((QDebug *)&local_78);
      QDebug::~QDebug((QDebug *)&local_88.yp);
      QDebug::~QDebug((QDebug *)&local_88);
      QDebug::~QDebug(&local_90);
    }
    dVar3 = (this_00->overshootPosition).xp + (this_00->contentPosition).xp;
    dVar4 = (this_00->overshootPosition).yp + (this_00->contentPosition).yp;
    local_b8.yp._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = dVar3;
    local_b8.xp._0_4_ = SUB84(dVar3,0);
    local_b8._4_8_ = auVar2._4_8_;
    bVar6 = qFuzzyCompare(&local_68,&local_b8);
    if (!bVar6) {
      QVar12 = velocity(this);
      iVar8 = 0;
      if (0 < scrollTime) {
        iVar8 = scrollTime;
      }
      QScrollerPrivate::createScrollToSegments
                (this_00,QVar12.xp,(double)iVar8 / 1000.0,local_68.xp,Horizontal,ScrollTypeScrollTo)
      ;
      QScrollerPrivate::createScrollToSegments
                (this_00,v,(double)iVar8 / 1000.0,local_68.yp,Vertical,ScrollTypeScrollTo);
      newstate = Scrolling;
      if (scrollTime < 1) {
        QScrollerPrivate::setContentPositionHelperScrolling(this_00);
        newstate = Inactive;
      }
      QScrollerPrivate::setState(this_00,newstate);
    }
  }
LAB_00662759:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScroller::scrollTo(const QPointF &pos, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    // no need to resend a prepare event if we are already scrolling
    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    QPointF newpos = clampToRect(pos, d->contentPosRange);
    qreal snapX = d->nextSnapPos(newpos.x(), 0, Qt::Horizontal);
    qreal snapY = d->nextSnapPos(newpos.y(), 0, Qt::Vertical);
    if (!qIsNaN(snapX))
        newpos.setX(snapX);
    if (!qIsNaN(snapY))
        newpos.setY(snapY);

    qCDebug(lcScroller) << "QScroller::scrollTo(req:" << pos << " [pix] / snap:"
                        << newpos << ", " << scrollTime << " [ms])";

    if (newpos == d->contentPosition + d->overshootPosition)
        return;

    QPointF vel = velocity();

    if (scrollTime < 0)
        scrollTime = 0;
    qreal time = qreal(scrollTime) / 1000;

    d->createScrollToSegments(vel.x(), time, newpos.x(), Qt::Horizontal, QScrollerPrivate::ScrollTypeScrollTo);
    d->createScrollToSegments(vel.y(), time, newpos.y(), Qt::Vertical, QScrollerPrivate::ScrollTypeScrollTo);

    if (!scrollTime)
        d->setContentPositionHelperScrolling();
    d->setState(scrollTime ? Scrolling : Inactive);
}